

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unordered_map_modifiers_test.h
# Opt level: O1

void __thiscall
phmap::priv::gtest_suite_ModifiersTest_::
InsertHint<phmap::parallel_flat_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_4UL,_std::mutex>_>
::TestBody(InsertHint<phmap::parallel_flat_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_4UL,_std::mutex>_>
           *this)

{
  undefined8 rhs;
  result_type_conflict1 rVar1;
  mt19937_64 *__urng;
  long lVar2;
  char *pcVar3;
  char *in_R9;
  pointer *__ptr;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar;
  T val2;
  T val;
  TypeParam m;
  AssertHelper local_7c0;
  AssertHelper local_7b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_7b0;
  undefined1 local_7a8 [8];
  Inner *local_7a0;
  __native_type local_798;
  AssertHelper local_770;
  undefined1 local_768 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_760;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_758;
  result_type_conflict1 local_748 [2];
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_740;
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  local_718;
  
  hash_internal::
  Generator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_void>
  ::operator()(&local_740,
               (Generator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_void>
                *)&local_718);
  lVar2 = 0x68;
  do {
    *(undefined8 *)((long)local_748 + lVar2 + -8) = 0;
    *(undefined8 *)((long)local_748 + lVar2) = 0;
    *(undefined8 *)((long)&local_760 + lVar2) = 0;
    *(undefined8 *)((long)local_748 + lVar2 + -0x10) = 0;
    *(undefined8 *)((long)&local_770.data_ + lVar2) = 0;
    *(undefined8 *)(local_768 + lVar2) = 0;
    *(undefined8 *)((long)&local_798 + lVar2 + 0x18) = 0;
    *(undefined8 *)((long)&local_798 + lVar2 + 0x20) = 0;
    *(undefined8 *)((long)&local_740.first._M_dataplus._M_p + lVar2) = 0;
    *(undefined8 *)((long)local_718.sets_._M_elems + lVar2 + -0x18) = 0;
    *(long *)((long)local_718.sets_._M_elems + lVar2 + -0x10) =
         hash_testing_internal::WithId<phmap::priv::StatefulTestingEqual>::
         next_id<phmap::priv::StatefulTestingEqual>()::gId;
    hash_testing_internal::WithId<phmap::priv::StatefulTestingEqual>::
    next_id<phmap::priv::StatefulTestingEqual>()::gId =
         hash_testing_internal::WithId<phmap::priv::StatefulTestingEqual>::
         next_id<phmap::priv::StatefulTestingEqual>()::gId + 1;
    *(long *)((long)local_718.sets_._M_elems + lVar2 + -8) =
         hash_testing_internal::WithId<phmap::priv::StatefulTestingHash>::
         next_id<phmap::priv::StatefulTestingHash>()::gId;
    hash_testing_internal::WithId<phmap::priv::StatefulTestingHash>::
    next_id<phmap::priv::StatefulTestingHash>()::gId =
         hash_testing_internal::WithId<phmap::priv::StatefulTestingHash>::
         next_id<phmap::priv::StatefulTestingHash>()::gId + 1;
    *(undefined8 *)
     ((long)&local_718.sets_._M_elems[0].super_Lockable.super_mutex.super___mutex_base._M_mutex +
     lVar2) = 0;
    lVar2 = lVar2 + 0x70;
  } while (lVar2 != 0x768);
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::
  emplace<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_&,_0>
            ((pair<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>::iterator,_bool>
              *)local_7a8,&local_718,&local_740);
  rhs = local_798._8_8_;
  local_768[0] = local_7a8 != (undefined1  [8])0x0;
  local_760 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_7a8 == (undefined1  [8])0x0) {
    testing::Message::Message((Message *)&local_7b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_7a8,(internal *)local_768,(AssertionResult *)"it != m.end()","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_7c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_map_modifiers_test.h"
               ,0x47,(char *)local_7a8);
    testing::internal::AssertHelper::operator=(&local_7c0,(Message *)&local_7b8);
    testing::internal::AssertHelper::~AssertHelper(&local_7c0);
    if (local_7a8 != (undefined1  [8])&local_798) {
      operator_delete((void *)local_7a8,(ulong)(local_798.__align + 1));
    }
    if ((long *)CONCAT71(local_7b8.data_._1_7_,local_7b8.data_._0_1_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_7b8.data_._1_7_,local_7b8.data_._0_1_) + 8))();
    }
  }
  if (local_760 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_760,local_760);
  }
  testing::internal::
  CmpHelperEQ<std::pair<std::__cxx11::string_const,int>,std::pair<std::__cxx11::string_const,int>>
            ((internal *)local_7a8,"val","*it",&local_740,
             (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
              *)rhs);
  if (local_7a8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_768);
    if (local_7a0 == (Inner *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (char *)(local_7a0->super_Lockable).super_mutex.super___mutex_base._M_mutex.__align;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_7b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_map_modifiers_test.h"
               ,0x48,pcVar3);
    testing::internal::AssertHelper::operator=(&local_7b8,(Message *)local_768);
    testing::internal::AssertHelper::~AssertHelper(&local_7b8);
    if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )local_768 !=
        (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(long *)local_768 + 8))();
    }
  }
  if (local_7a0 != (Inner *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_7a0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_7a0);
  }
  local_7a8 = (undefined1  [8])0x7fffffff00000000;
  __urng = hash_internal::GetSharedRng();
  rVar1 = std::uniform_int_distribution<int>::operator()
                    ((uniform_int_distribution<int> *)local_7a8,__urng,(param_type *)local_7a8);
  local_768 = (undefined1  [8])&local_758;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_768,local_740.first._M_dataplus._M_p,
             local_740.first._M_dataplus._M_p + local_740.first._M_string_length);
  local_748[0] = rVar1;
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::
  emplace<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_&,_0>
            ((pair<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>::iterator,_bool>
              *)local_7a8,&local_718,
             (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
              *)local_768);
  local_7b8.data_._0_1_ = (internal)(local_7a8 != (undefined1  [8])0x0);
  local_7b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_7b8.data_._0_1_) {
    testing::Message::Message((Message *)&local_7c0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_7a8,(internal *)&local_7b8,(AssertionResult *)"it != m.end()","false"
               ,"true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_770,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_map_modifiers_test.h"
               ,0x4b,(char *)local_7a8);
    testing::internal::AssertHelper::operator=(&local_770,(Message *)&local_7c0);
    testing::internal::AssertHelper::~AssertHelper(&local_770);
    if (local_7a8 != (undefined1  [8])&local_798) {
      operator_delete((void *)local_7a8,(ulong)(local_798.__align + 1));
    }
    if (local_7c0.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_7c0.data_ + 8))();
    }
  }
  if (local_7b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_7b0,local_7b0);
  }
  testing::internal::
  CmpHelperEQ<std::pair<std::__cxx11::string_const,int>,std::pair<std::__cxx11::string_const,int>>
            ((internal *)local_7a8,"val","*it",&local_740,
             (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
              *)local_798._8_8_);
  if (local_7a8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_7b8);
    if (local_7a0 == (Inner *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (char *)(local_7a0->super_Lockable).super_mutex.super___mutex_base._M_mutex.__align;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_7c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_map_modifiers_test.h"
               ,0x4c,pcVar3);
    testing::internal::AssertHelper::operator=(&local_7c0,(Message *)&local_7b8);
    testing::internal::AssertHelper::~AssertHelper(&local_7c0);
    if ((long *)CONCAT71(local_7b8.data_._1_7_,local_7b8.data_._0_1_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_7b8.data_._1_7_,local_7b8.data_._0_1_) + 8))();
    }
  }
  if (local_7a0 != (Inner *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_7a0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_7a0);
  }
  if (local_768 != (undefined1  [8])&local_758) {
    operator_delete((void *)local_768,local_758._M_allocated_capacity + 1);
  }
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::~parallel_hash_set(&local_718);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_740.first._M_dataplus._M_p != &local_740.first.field_2) {
    operator_delete(local_740.first._M_dataplus._M_p,
                    local_740.first.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

TYPED_TEST_P(ModifiersTest, InsertHint) {
  using T = hash_internal::GeneratedType<TypeParam>;
  using V = typename TypeParam::mapped_type;
  T val = hash_internal::Generator<T>()();
  TypeParam m;
  auto it = m.insert(m.end(), val);
  EXPECT_TRUE(it != m.end());
  EXPECT_EQ(val, *it);
  T val2 = {val.first, hash_internal::Generator<V>()()};
  it = m.insert(it, val2);
  EXPECT_TRUE(it != m.end());
  EXPECT_EQ(val, *it);
}